

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O1

HighsTask * __thiscall HighsSplitDeque::randomSteal(HighsSplitDeque *this)

{
  int iVar1;
  uint uVar2;
  uint32_t uVar3;
  HighsTask *pHVar4;
  
  iVar1 = (this->ownerData).numWorkers;
  uVar3 = 0;
  if (2 < iVar1) {
    uVar2 = 0x1f;
    if (iVar1 - 2U != 0) {
      for (; iVar1 - 2U >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar3 = HighsRandom::drawUniform
                      (&(this->ownerData).randgen,iVar1 - 1,(uVar2 ^ 0xffffffe0) + 0x21);
  }
  pHVar4 = steal((this->ownerData).workers[(int)(((this->ownerData).ownerId <= (int)uVar3) + uVar3)]
                 ._M_t.
                 super___uniq_ptr_impl<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsSplitDeque_*,_highs::cache_aligned::Deleter<HighsSplitDeque>_>
                 .super__Head_base<0UL,_HighsSplitDeque_*,_false>._M_head_impl);
  return pHVar4;
}

Assistant:

HighsTask* randomSteal() {
    HighsInt next = ownerData.randgen.integer(ownerData.numWorkers - 1);
    next += next >= ownerData.ownerId;
    assert(next != ownerData.ownerId);
    assert(next >= 0);
    assert(next < ownerData.numWorkers);

    return ownerData.workers[next]->steal();
  }